

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thin_server.c
# Opt level: O0

int EVthin_socket_listen(CManager cm,char **hostname_p,int *port_p)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  int iVar4;
  time_t tVar5;
  pthread_t pVar6;
  char *pcVar7;
  uint *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  double dVar8;
  double dVar9;
  timespec ts;
  int target;
  int result;
  int tries;
  int size;
  long seedval;
  int low_bound;
  int high_bound;
  char host_name [256];
  u_short port_num;
  int int_port_num;
  int conn_sock;
  int sock_opt_val;
  sockaddr_in sock_addr;
  uint length;
  int *in_stack_fffffffffffffe58;
  CManager_conflict in_stack_fffffffffffffe60;
  long in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  timespec local_178;
  uint local_168;
  CMTraceType trace_type;
  int local_150;
  int local_14c;
  char local_148 [262];
  uint16_t local_42;
  uint local_40;
  int local_3c;
  undefined4 local_38;
  sockaddr local_34;
  socklen_t local_24;
  uint *local_20;
  undefined8 *local_18;
  long local_10;
  int local_4;
  
  local_38 = 1;
  local_40 = 0;
  local_42 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  CMget_port_range(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(int *)0x15a096);
  local_3c = socket(2,1,0);
  if (local_3c == -1) {
    fprintf(_stderr,"Cannot open INET socket\n");
    local_4 = 0;
  }
  else {
    local_34.sa_family = 2;
    local_34.sa_data[2] = '\0';
    local_34.sa_data[3] = '\0';
    local_34.sa_data[4] = '\0';
    local_34.sa_data[5] = '\0';
    local_34.sa_data._0_2_ = htons(local_42);
    iVar1 = setsockopt(local_3c,1,2,&local_38,4);
    if (iVar1 == 0) {
      tVar5 = time((time_t *)0x0);
      _Var2 = getpid();
      iVar3 = local_14c - local_150;
      iVar1 = 0x1e;
      trace_type = ~CMAlwaysTrace;
      srand48(tVar5 + _Var2);
      while (iVar4 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20), 0 < iVar1) {
        dVar8 = (double)iVar3;
        in_stack_fffffffffffffe74 = local_150;
        dVar9 = drand48();
        local_168 = in_stack_fffffffffffffe74 + (int)(dVar8 * dVar9);
        local_34.sa_data._0_2_ = htons((uint16_t)local_168);
        iVar4 = CMtrace_val[2];
        if (*(long *)(local_10 + 0x120) == 0) {
          iVar4 = CMtrace_init((CManager)CONCAT44(iVar3,iVar1),trace_type);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            in_stack_fffffffffffffe60 = *(CManager_conflict *)(local_10 + 0x120);
            _Var2 = getpid();
            in_stack_fffffffffffffe68 = (long)_Var2;
            pVar6 = pthread_self();
            fprintf((FILE *)in_stack_fffffffffffffe60,"P%lxT%lx - ",in_stack_fffffffffffffe68,pVar6)
            ;
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_178);
            fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_178.tv_sec,local_178.tv_nsec)
            ;
          }
          fprintf(*(FILE **)(local_10 + 0x120),"CMSocket trying to bind port %d",(ulong)local_168);
        }
        fflush(*(FILE **)(local_10 + 0x120));
        trace_type = bind(local_3c,&local_34,0x10);
        local_40 = local_168;
        iVar1 = iVar1 + -1;
        if (trace_type != ~CMAlwaysTrace) {
          iVar1 = 0;
        }
        if (iVar1 % 5 == 4) {
          in_stack_fffffffffffffe58 = (int *)time((time_t *)0x0);
          _Var2 = getpid();
          srand48((long)in_stack_fffffffffffffe58 + (long)_Var2);
        }
        if (iVar1 == 0x14) {
          iVar3 = iVar3 * 10;
        }
        if (iVar1 == 10) {
          iVar3 = iVar3 * 10;
        }
      }
      local_38 = 1;
      iVar1 = setsockopt(local_3c,1,2,&local_38,4);
      if (iVar1 == 0) {
        local_24 = 0x10;
        iVar1 = getsockname(local_3c,&local_34,&local_24);
        if (iVar1 < 0) {
          fprintf(_stderr,"Cannot get socket name\n");
          local_4 = 0;
        }
        else {
          iVar1 = listen(local_3c,0x400);
          if (iVar1 == 0) {
            CM_fd_add_select((CManager_conflict)
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),iVar4,
                             (select_func)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                             (void *)0x15a4a9);
            CMget_qual_hostname(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,0);
            pcVar7 = strdup(local_148);
            *local_18 = pcVar7;
            *local_20 = local_40;
            local_4 = 1;
          }
          else {
            fprintf(_stderr,"listen failed\n");
            local_4 = 0;
          }
        }
      }
      else {
        perror("Failed to set 2REUSEADDR on INET socket");
        local_4 = 0;
      }
    }
    else {
      fprintf(_stderr,"Failed to set 1REUSEADDR on INET socket\n");
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

extern int
EVthin_socket_listen(CManager cm,  char **hostname_p, int *port_p)
{

    unsigned int length;
    struct sockaddr_in sock_addr;
    int sock_opt_val = 1;
    SOCKET conn_sock;
    int int_port_num = 0;
    u_short port_num = 0;
    char host_name[256];
    int high_bound, low_bound;
    CMget_port_range(cm, &high_bound, &low_bound);

    conn_sock = socket(AF_INET, SOCK_STREAM, 0);
    if (conn_sock == SOCKET_ERROR) {
	fprintf(stderr, "Cannot open INET socket\n");
	return 0;
    }
    sock_addr.sin_family = AF_INET;
    sock_addr.sin_addr.s_addr = INADDR_ANY;
    sock_addr.sin_port = (unsigned short) (htons(port_num));
    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEADDR, (char *) &sock_opt_val,
		   sizeof(sock_opt_val)) != 0) {
	fprintf(stderr, "Failed to set 1REUSEADDR on INET socket\n");
	return 0;
    }
    {
	long seedval = (long)time(NULL) + (long)getpid();
	/* port num is free.  Constrain to range to standards */
	int size = high_bound - low_bound;
	int tries = 30;
	int result = SOCKET_ERROR;
	srand48(seedval);
	while (tries > 0) {
	    int target = low_bound + (int)(size * drand48());
	    sock_addr.sin_port = htons(target);
	    CMtrace_out(cm, CMConnectionVerbose, "CMSocket trying to bind port %d", target);
	    result = bind(conn_sock, (struct sockaddr *) &sock_addr,
			  sizeof sock_addr);
	    int_port_num = target;
	    tries--;
	    if (result != SOCKET_ERROR) tries = 0;
	    if (tries%5 == 4) {
		/* try reseeding in case we're in sync with another process */
		srand48(time(NULL) + getpid());
	    }
	    if (tries == 20) {
		/* damn, tried a lot, increase the range (This might violate specified range) */
		size *= 10;
	    }
	    if (tries == 10) {
		/* damn, tried a lot more, increase the range (This might violate specified range) */
		size *= 10;
	    }
	}
    }
    /*    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
	     sizeof sock_addr) == SOCKET_ERROR) {
	fprintf(stderr, "Cannot bind INET socket\n");
	return 0;
	}*/
    sock_opt_val = 1;
    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEADDR, (char *) &sock_opt_val,
		   sizeof(sock_opt_val)) != 0) {
	perror("Failed to set 2REUSEADDR on INET socket");
	return 0;
    }
    length = sizeof sock_addr;
    if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	fprintf(stderr, "Cannot get socket name\n");
	return 0;
    }
    /* begin listening for conns and set the backlog */
    if (listen(conn_sock, FD_SETSIZE)) {
	fprintf(stderr, "listen failed\n");
	return 0;
    }
    /* set the port num as one we can be contacted at */
    
    CM_fd_add_select(cm, conn_sock, socket_accept_thin_client,
		    (void *) cm, (void *) (intptr_t)conn_sock);
    

    //    int_port_num = (unsigned short)(ntohs(sock_addr.sin_port));

    CMget_qual_hostname(cm, host_name, sizeof(host_name));
	
    *hostname_p = strdup(host_name);
    *port_p = int_port_num;
    return 1;
}